

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalFileInputSource.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::LocalFileInputSource::LocalFileInputSource
          (LocalFileInputSource *this,XMLCh *filePath,MemoryManager *manager)

{
  short *psVar1;
  bool bVar2;
  int iVar3;
  XMLCh *pXVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  size_t __n;
  XMLCh *target;
  
  InputSource::InputSource(&this->super_InputSource,manager);
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__LocalFileInputSource_00413488;
  bVar2 = XMLPlatformUtils::isRelative(filePath,manager);
  if (bVar2) {
    pXVar4 = XMLPlatformUtils::getCurrentDirectory(manager);
    lVar6 = 0;
    if (pXVar4 != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)pXVar4 + lVar6);
        lVar6 = lVar6 + 2;
      } while (*psVar1 != 0);
      lVar6 = (lVar6 >> 1) + -1;
    }
    lVar5 = 0;
    if (filePath != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)filePath + lVar5);
        lVar5 = lVar5 + 2;
      } while (*psVar1 != 0);
      lVar5 = (lVar5 >> 1) + -1;
    }
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,(lVar5 + lVar6) * 2 + 4);
    target = (XMLCh *)CONCAT44(extraout_var,iVar3);
    XMLString::copyString(target,pXVar4);
    target[lVar6] = L'/';
    XMLString::copyString(target + lVar6 + 1,filePath);
    XMLPlatformUtils::removeDotSlash(target,manager);
    XMLPlatformUtils::removeDotDotSlash(target,manager);
    (*(this->super_InputSource)._vptr_InputSource[9])(this,target);
    (*manager->_vptr_MemoryManager[4])(manager,pXVar4);
    (*manager->_vptr_MemoryManager[4])(manager,target);
  }
  else {
    if (filePath == (XMLCh *)0x0) {
      pXVar4 = (XMLCh *)0x0;
    }
    else {
      __n = 0;
      do {
        psVar1 = (short *)((long)filePath + __n);
        __n = __n + 2;
      } while (*psVar1 != 0);
      iVar3 = (*manager->_vptr_MemoryManager[3])(manager,__n);
      pXVar4 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
      memcpy(pXVar4,filePath,__n);
    }
    XMLPlatformUtils::removeDotSlash(pXVar4,manager);
    (*(this->super_InputSource)._vptr_InputSource[9])(this,pXVar4);
    (*manager->_vptr_MemoryManager[4])(manager,pXVar4);
  }
  return;
}

Assistant:

LocalFileInputSource::LocalFileInputSource(const XMLCh* const filePath,
                                           MemoryManager* const manager)
    : InputSource(manager)
{

    //
    //  If the path is relative, then complete it acording to the current
    //  working directory rules of the current platform. Else, just take
    //  it as is.
    //
    if (XMLPlatformUtils::isRelative(filePath, manager))
    {
        XMLCh* curDir = XMLPlatformUtils::getCurrentDirectory(manager);

        XMLSize_t curDirLen = XMLString::stringLen(curDir);
        XMLSize_t filePathLen = XMLString::stringLen(filePath);
        XMLCh* fullDir = (XMLCh*) manager->allocate
        (
            (curDirLen + filePathLen + 2) * sizeof(XMLCh)
        );//new XMLCh [ curDirLen + filePathLen + 2];

        XMLString::copyString(fullDir, curDir);
        fullDir[curDirLen] = chForwardSlash;
        XMLString::copyString(&fullDir[curDirLen+1], filePath);
        
        XMLPlatformUtils::removeDotSlash(fullDir, manager);
        XMLPlatformUtils::removeDotDotSlash(fullDir, manager);

        setSystemId(fullDir);

        manager->deallocate(curDir);//delete [] curDir;
        manager->deallocate(fullDir);//delete [] fullDir;
    }
     else
    {
        XMLCh* tmpBuf = XMLString::replicate(filePath, manager);
        XMLPlatformUtils::removeDotSlash(tmpBuf, manager);
        setSystemId(tmpBuf);
        manager->deallocate(tmpBuf);//delete [] tmpBuf;
    }

}